

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetTargetDependInfoPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *psVar1;
  cmGlobalNinjaGenerator *pcVar2;
  char local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  psVar1 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  local_80.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_80.View_._M_len = psVar1->_M_string_length;
  local_50.View_._M_str = local_50.Digits_;
  local_50.View_._M_len = 1;
  local_50.Digits_[0] = '/';
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_a0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = GetGlobalGenerator(this);
  (*(pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_c0,pcVar2,config);
  local_c1 = '/';
  cmStrCat<std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string,char[16]>
            (__return_storage_ptr__,&local_80,&local_50,&local_a0,&local_c0,&local_c1,lang,
             (char (*) [16])"DependInfo.json");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetDependInfoPath(
  std::string const& lang, const std::string& config) const
{
  std::string path =
    cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/',
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/', lang,
             "DependInfo.json");
  return path;
}